

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>::
TestBody(SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
         *this)

{
  anon_class_24_3_2b76d57f_for_f f;
  long lVar1;
  long lVar2;
  char *message;
  atomic<int> nread;
  TypeParam mtx;
  duration<long,_std::ratio<1L,_1000L>_> local_140;
  duration<long,_std::ratio<1L,_1000L>_> local_138;
  internal local_130 [8];
  undefined8 *local_128;
  atomic<int> local_11c;
  undefined8 *local_118;
  undefined8 *puStack_110;
  atomic<int> *local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  condition_variable local_e0 [48];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  condition_variable local_78 [48];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_100 = 0;
  local_f8 = (undefined8 *)operator_new(0x28);
  local_f0 = local_f8 + 5;
  *local_f8 = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[4] = 0;
  local_e8 = local_f0;
  std::condition_variable::condition_variable(local_e0);
  local_90 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_88 = 0;
  uStack_80 = 0;
  std::condition_variable::condition_variable(local_78);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_11c.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  lVar1 = std::chrono::_V2::system_clock::now();
  local_118 = &local_100;
  puStack_110 = &local_88;
  f.mtx = (TypeParam *)puStack_110;
  f.phaser = (phaser *)local_118;
  f.nread = &local_11c;
  local_108 = &local_11c;
  yamc::test::
  task_runner<SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>>::TestBody()::_lambda(unsigned_long)_1_>
            (5,f);
  local_138.__r = (rep)&DAT_00000190;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_140.__r = (lVar2 - lVar1) / 1000;
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (local_130,"std::chrono::milliseconds(200) * 2","sw.elapsed()",&local_138,&local_140);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_128 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_128;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x50,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((long *)local_138.__r != (long *)0x0) {
      (**(code **)(*(long *)local_138.__r + 8))();
    }
  }
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(local_128);
  }
  std::condition_variable::~condition_variable(local_78);
  std::condition_variable::~condition_variable(local_e0);
  if (local_f8 != (undefined8 *)0x0) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, Lock)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  std::atomic<int> nread = {};
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ph.await();     // p1
        EXPECT_NO_THROW(mtx.lock());
        EXPECT_EQ(TEST_READER_THREADS, nread);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ASSERT_NO_THROW(mtx.lock_shared());
        ph.advance(1);  // p1
        ++nread;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}